

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4495f9::ECCurveTest_SetAffine_Test::TestBody(ECCurveTest_SetAffine_Test *this)

{
  EC_GROUP *group;
  UniquePtr<BIGNUM> UVar1;
  int iVar2;
  ParamType_conflict *pPVar3;
  EC_POINT *p_00;
  BIGNUM *pBVar4;
  char *in_R9;
  AssertHelper local_80;
  UniquePtr<EC_POINT> invalid_point;
  AssertHelper local_70;
  UniquePtr<BIGNUM> y;
  UniquePtr<EC_POINT> point;
  string local_58;
  UniquePtr<BIGNUM> x;
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> p;
  UniquePtr<EC_KEY> key;
  
  pPVar3 = testing::WithParamInterface<int>::GetParam();
  key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
       EC_KEY_new_by_curve_name(*pPVar3);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ec_key_st_*,_bssl::internal::Deleter>)
       key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ec_key_st_*,_false>)0x0;
  if ((tuple<ec_key_st_*,_bssl::internal::Deleter>)
      key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ec_key_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&x);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&gtest_ar_,(AssertionResult *)0x55f7b2,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&y,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x223,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&y,(Message *)&x);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar2 = EC_KEY_generate_key((EC_KEY *)
                                key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 != 0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      x._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (tuple<bignum_st_*,_bssl::internal::Deleter>)
           x._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_bignum_st_*,_false>)0x0;
      if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
          x._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&y);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_58,(internal *)&gtest_ar_,(AssertionResult *)0x50c83d,"false","true",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&p,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x228,local_58._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&p,(Message *)&y);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
        std::__cxx11::string::~string((string *)&local_58);
        if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
            y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
          (**(code **)(*(long *)y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (tuple<bignum_st_*,_bssl::internal::Deleter>)
             y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
             (_Head_base<0UL,_bignum_st_*,_false>)0x0;
        if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
            y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
            (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
          testing::Message::Message((Message *)&p);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_58,(internal *)&gtest_ar_,(AssertionResult *)0x51fbb4,"false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&point,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x22a,local_58._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)&point,(Message *)&p);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&point);
          std::__cxx11::string::~string((string *)&local_58);
          if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
              p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                  _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (tuple<bignum_st_*,_bssl::internal::Deleter>)
               p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
               (_Head_base<0UL,_bignum_st_*,_false>)0x0;
          if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
              p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
              (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
            testing::Message::Message((Message *)&point);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_58,(internal *)&gtest_ar_,(AssertionResult *)0x4c5fec,"false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&invalid_point,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x22c,local_58._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&invalid_point,(Message *)&point);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&invalid_point);
            std::__cxx11::string::~string((string *)&local_58);
            if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
                point._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)point._M_t.
                                    super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t
                                    .super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8))()
              ;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            group = (this->super_ECCurveTest).group_;
            p_00 = EC_KEY_get0_public_key
                             ((EC_KEY *)
                              key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
            iVar2 = EC_POINT_get_affine_coordinates_GFp
                              ((EC_GROUP *)group,p_00,
                               (BIGNUM *)
                               x._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                               (BIGNUM *)
                               y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BN_CTX *)0x0)
            ;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar2 != 0;
            if (!gtest_ar_.success_) {
              testing::Message::Message((Message *)&point);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_58,(internal *)&gtest_ar_,
                         (AssertionResult *)
                         "EC_POINT_get_affine_coordinates_GFp( group(), EC_KEY_get0_public_key(key.get()), x.get(), y.get(), nullptr)"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&invalid_point,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x22e,local_58._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&invalid_point,(Message *)&point);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&invalid_point);
              std::__cxx11::string::~string((string *)&local_58);
              if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
                  point._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)point._M_t.
                                      super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8)
                )();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            iVar2 = EC_GROUP_get_curve_GFp
                              ((EC_GROUP *)(this->super_ECCurveTest).group_,
                               (BIGNUM *)
                               p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BIGNUM *)0x0,
                               (BIGNUM *)0x0,(BN_CTX *)0x0);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar2 != 0;
            if (!gtest_ar_.success_) {
              testing::Message::Message((Message *)&point);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_58,(internal *)&gtest_ar_,
                         (AssertionResult *)
                         "EC_GROUP_get_curve_GFp(group(), p.get(), nullptr, nullptr, nullptr)",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&invalid_point,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x230,local_58._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&invalid_point,(Message *)&point);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&invalid_point);
              std::__cxx11::string::~string((string *)&local_58);
              if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
                  point._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)point._M_t.
                                      super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8)
                )();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            point._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
                 EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ =
                 (tuple<ec_point_st_*,_bssl::internal::Deleter>)
                 point._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                 (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
            if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
                point._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
                (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
              testing::Message::Message((Message *)&invalid_point);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_58,(internal *)&gtest_ar_,(AssertionResult *)0x4ade0a,"false","true"
                         ,in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_80,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x234,local_58._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_80,(Message *)&invalid_point);
              testing::internal::AssertHelper::~AssertHelper(&local_80);
              std::__cxx11::string::~string((string *)&local_58);
              if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
                  invalid_point._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                  _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)invalid_point._M_t.
                                      super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8)
                )();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              iVar2 = EC_POINT_set_affine_coordinates_GFp
                                ((EC_GROUP *)(this->super_ECCurveTest).group_,
                                 (EC_POINT *)
                                 point._M_t.
                                 super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                 (BIGNUM *)
                                 x._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                 (BIGNUM *)
                                 y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                 (BN_CTX *)0x0);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_.success_ = iVar2 != 0;
              if (!gtest_ar_.success_) {
                testing::Message::Message((Message *)&invalid_point);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_58,(internal *)&gtest_ar_,
                           (AssertionResult *)
                           "EC_POINT_set_affine_coordinates_GFp(group(), point.get(), x.get(), y.get(), nullptr)"
                           ,"false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x236,local_58._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&invalid_point);
                testing::internal::AssertHelper::~AssertHelper(&local_80);
                std::__cxx11::string::~string((string *)&local_58);
                if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
                    invalid_point._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                    _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
                  (**(code **)(*(long *)invalid_point._M_t.
                                        super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              UVar1 = y;
              pBVar4 = BN_value_one();
              iVar2 = BN_sub((BIGNUM *)
                             UVar1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                             (BIGNUM *)
                             UVar1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,pBVar4);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_.success_ = iVar2 != 0;
              if (!gtest_ar_.success_) {
                testing::Message::Message((Message *)&invalid_point);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_58,(internal *)&gtest_ar_,
                           (AssertionResult *)"BN_sub(y.get(), y.get(), BN_value_one())","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x239,local_58._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&invalid_point);
                testing::internal::AssertHelper::~AssertHelper(&local_80);
                std::__cxx11::string::~string((string *)&local_58);
                if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
                    invalid_point._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                    _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
                  (**(code **)(*(long *)invalid_point._M_t.
                                        super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              invalid_point._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
                   EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_.success_ =
                   (tuple<ec_point_st_*,_bssl::internal::Deleter>)
                   invalid_point._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                   (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
              if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
                  invalid_point._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                  _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
                  (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
                testing::Message::Message((Message *)&local_80);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_58,(internal *)&gtest_ar_,(AssertionResult *)"invalid_point",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x23d,local_58._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
LAB_0029c147:
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                std::__cxx11::string::~string((string *)&local_58);
                if (local_80.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_80.data_ + 8))();
                }
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                iVar2 = EC_POINT_set_affine_coordinates_GFp
                                  ((EC_GROUP *)(this->super_ECCurveTest).group_,
                                   (EC_POINT *)
                                   invalid_point._M_t.
                                   super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                   (BIGNUM *)
                                   x._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                   _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                   (BIGNUM *)
                                   y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                   _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                   (BN_CTX *)0x0);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar2 == 0;
                if (!gtest_ar_.success_) {
                  testing::Message::Message((Message *)&local_80);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_58,(internal *)&gtest_ar_,
                             (AssertionResult *)
                             "EC_POINT_set_affine_coordinates_GFp(group(), invalid_point.get(), x.get(), y.get(), nullptr)"
                             ,"true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x23f,local_58._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                  std::__cxx11::string::~string((string *)&local_58);
                  if (local_80.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_80.data_ + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                UVar1 = y;
                pBVar4 = BN_value_one();
                iVar2 = BN_add((BIGNUM *)
                               UVar1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                               (BIGNUM *)
                               UVar1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,pBVar4);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar2 != 0;
                if (!gtest_ar_.success_) {
                  testing::Message::Message((Message *)&local_80);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_58,(internal *)&gtest_ar_,
                             (AssertionResult *)"BN_add(y.get(), y.get(), BN_value_one())","false",
                             "true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x242,local_58._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                  std::__cxx11::string::~string((string *)&local_58);
                  if (local_80.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_80.data_ + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                iVar2 = BN_add((BIGNUM *)
                               y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                               (BIGNUM *)
                               y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                               (BIGNUM *)
                               p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar2 != 0;
                if (!gtest_ar_.success_) {
                  testing::Message::Message((Message *)&local_80);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_58,(internal *)&gtest_ar_,
                             (AssertionResult *)"BN_add(y.get(), y.get(), p.get())","false","true",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x243,local_58._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                  std::__cxx11::string::~string((string *)&local_58);
                  if (local_80.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_80.data_ + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                iVar2 = EC_POINT_set_affine_coordinates_GFp
                                  ((EC_GROUP *)(this->super_ECCurveTest).group_,
                                   (EC_POINT *)
                                   invalid_point._M_t.
                                   super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                   (BIGNUM *)
                                   x._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                   _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                   (BIGNUM *)
                                   y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                   _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                   (BN_CTX *)0x0);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar2 == 0;
                if (!gtest_ar_.success_) {
                  testing::Message::Message((Message *)&local_80);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_58,(internal *)&gtest_ar_,
                             (AssertionResult *)
                             "EC_POINT_set_affine_coordinates_GFp(group(), invalid_point.get(), x.get(), y.get(), nullptr)"
                             ,"true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x246,local_58._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                  std::__cxx11::string::~string((string *)&local_58);
                  if (local_80.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_80.data_ + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                iVar2 = EC_KEY_set_public_key_affine_coordinates
                                  ((EC_KEY *)
                                   key._M_t.
                                   super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl,
                                   (BIGNUM *)
                                   x._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                   _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                   (BIGNUM *)
                                   y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                   _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar2 == 0;
                if (!gtest_ar_.success_) {
                  testing::Message::Message((Message *)&local_80);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_58,(internal *)&gtest_ar_,
                             (AssertionResult *)
                             "EC_KEY_set_public_key_affine_coordinates(key.get(), x.get(), y.get())"
                             ,"true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x248,local_58._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
                  goto LAB_0029c147;
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&invalid_point);
            }
            std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&point);
          }
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&p);
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&y);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&x);
      goto LAB_0029c1a5;
    }
    testing::Message::Message((Message *)&x);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&gtest_ar_,(AssertionResult *)"EC_KEY_generate_key(key.get())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&y,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x224,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&y,(Message *)&x);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&y);
  std::__cxx11::string::~string((string *)&local_58);
  if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
      x._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
    (**(code **)(*(long *)x._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_0029c1a5:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&key);
  return;
}

Assistant:

TEST_P(ECCurveTest, SetAffine) {
  // Generate an EC_KEY.
  bssl::UniquePtr<EC_KEY> key(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_generate_key(key.get()));

  // Get the public key's coordinates.
  bssl::UniquePtr<BIGNUM> x(BN_new());
  ASSERT_TRUE(x);
  bssl::UniquePtr<BIGNUM> y(BN_new());
  ASSERT_TRUE(y);
  bssl::UniquePtr<BIGNUM> p(BN_new());
  ASSERT_TRUE(p);
  EXPECT_TRUE(EC_POINT_get_affine_coordinates_GFp(
      group(), EC_KEY_get0_public_key(key.get()), x.get(), y.get(), nullptr));
  EXPECT_TRUE(
      EC_GROUP_get_curve_GFp(group(), p.get(), nullptr, nullptr, nullptr));

  // Points on the curve should be accepted.
  auto point = bssl::UniquePtr<EC_POINT>(EC_POINT_new(group()));
  ASSERT_TRUE(point);
  EXPECT_TRUE(EC_POINT_set_affine_coordinates_GFp(group(), point.get(), x.get(),
                                                  y.get(), nullptr));

  // Subtract one from |y| to make the point no longer on the curve.
  EXPECT_TRUE(BN_sub(y.get(), y.get(), BN_value_one()));

  // Points not on the curve should be rejected.
  bssl::UniquePtr<EC_POINT> invalid_point(EC_POINT_new(group()));
  ASSERT_TRUE(invalid_point);
  EXPECT_FALSE(EC_POINT_set_affine_coordinates_GFp(group(), invalid_point.get(),
                                                   x.get(), y.get(), nullptr));

  // Coordinates out of range should be rejected.
  EXPECT_TRUE(BN_add(y.get(), y.get(), BN_value_one()));
  EXPECT_TRUE(BN_add(y.get(), y.get(), p.get()));

  EXPECT_FALSE(EC_POINT_set_affine_coordinates_GFp(group(), invalid_point.get(),
                                                   x.get(), y.get(), nullptr));
  EXPECT_FALSE(
      EC_KEY_set_public_key_affine_coordinates(key.get(), x.get(), y.get()));
}